

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeConvert_value.c
# Opt level: O0

void truncSat_op(vm *v,instruction *inst)

{
  float32 fVar1;
  float64 fVar2;
  double dVar3;
  byte op;
  stack *s;
  instruction *inst_local;
  vm *v_local;
  
  switch(*inst->arg) {
  case 0:
    fVar1 = popF32(&v->operandStack);
    dVar3 = trunc((double)(float)fVar1);
    pushS32(&v->operandStack,(int)dVar3);
    break;
  case 1:
    fVar1 = popF32(&v->operandStack);
    dVar3 = trunc((double)(float)fVar1);
    pushU32(&v->operandStack,(uint32)(long)dVar3);
    break;
  case 2:
    fVar2 = popF64(&v->operandStack);
    dVar3 = trunc((double)fVar2);
    pushS32(&v->operandStack,(int)dVar3);
    break;
  case 3:
    fVar2 = popF64(&v->operandStack);
    dVar3 = trunc((double)fVar2);
    pushU32(&v->operandStack,(uint32)(long)dVar3);
    break;
  case 4:
    fVar1 = popF32(&v->operandStack);
    dVar3 = trunc((double)(float)fVar1);
    pushS64(&v->operandStack,(long)dVar3);
    break;
  case 5:
    fVar1 = popF32(&v->operandStack);
    dVar3 = trunc((double)(float)fVar1);
    pushU64(&v->operandStack,
            (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f);
    break;
  case 6:
    fVar2 = popF64(&v->operandStack);
    dVar3 = trunc((double)fVar2);
    pushS64(&v->operandStack,(long)dVar3);
    break;
  case 7:
    fVar2 = popF64(&v->operandStack);
    dVar3 = trunc((double)fVar2);
    pushU64(&v->operandStack,
            (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f);
  }
  return;
}

Assistant:

void truncSat_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    byte op = *(byte *) (inst->arg);
    switch (op) {
        case 0x00:
            pushS32(s, (int32) (trunc((float64) popF32(s))));
            break;
        case 0x01:
            pushU32(s, (uint32) (trunc((float64) popF32(s))));
            break;
        case 0x02:
            pushS32(s, (int32) (trunc(popF64(s))));
            break;
        case 0x03:
            pushU32(s, (uint32) (trunc(popF64(s))));
            break;
        case 0x04:
            pushS64(s, (int64) (trunc((float64) popF32(s))));
            break;
        case 0x05:
            pushU64(s, (uint64) (trunc((float64) popF32(s))));
            break;
        case 0x06:
            pushS64(s, (int64) (trunc(popF64(s))));
            break;
        case 0x07:
            pushU64(s, (uint64) (trunc(popF64(s))));
            break;
        default:
            break;
    }
}